

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O3

void __thiscall QHostInfoResult::finalizePostResultsReady(QHostInfoResult *this,QHostInfo *info)

{
  Data *pDVar1;
  QSlotObjectBase *pQVar2;
  QObject *pQVar3;
  long in_FS_OFFSET;
  void *local_28;
  QHostInfo *local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->receiver).wp.d;
  if ((pDVar1 != (Data *)0x0) &&
     (pQVar3 = (this->receiver).wp.value,
     pQVar3 != (QObject *)0x0 && (pDVar1->strongref)._q_value.super___atomic_base<int>._M_i != 0)) {
    local_28 = (void *)0x0;
    pQVar2 = (this->slotObj)._M_t.
             super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>.
             _M_t.
             super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
             .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl;
    if ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0) {
      pQVar3 = (QObject *)0x0;
    }
    local_20 = info;
    (*pQVar2->m_impl)(1,pQVar2,pQVar3,&local_28,(bool *)0x0);
  }
  QObject::deleteLater();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHostInfoResult::finalizePostResultsReady(const QHostInfo &info)
{
    Q_ASSERT(slotObj);

    // we used to have a context object, but it's already destroyed
    if (receiver) {
        void *args[] = { nullptr, const_cast<QHostInfo *>(&info) };
        slotObj->call(const_cast<QObject *>(receiver.data()), args);
    }

    deleteLater();
}